

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst_sse4.c
# Opt level: O2

void av1_calc_proj_params_sse4_1
               (uint8_t *src8,int width,int height,int src_stride,uint8_t *dat8,int dat_stride,
               int32_t *flt0,int flt0_stride,int32_t *flt1,int flt1_stride,int64_t (*H) [2],
               int64_t *C,sgr_params_type *params)

{
  int *piVar1;
  int *piVar2;
  ulong uVar3;
  int j;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  undefined1 in_XMM2 [16];
  long lVar11;
  long lVar12;
  undefined1 in_XMM3 [16];
  long lVar15;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  long lVar16;
  long lVar19;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  int iVar24;
  int iVar26;
  int iVar27;
  undefined1 in_XMM8 [16];
  undefined1 auVar25 [16];
  int iVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  
  if (params->r[0] < 1) {
    if (params->r[1] < 1) {
      return;
    }
    uVar5 = 0;
    uVar3 = 0;
    if (0 < height) {
      uVar3 = (ulong)(uint)height;
    }
    lVar10 = 0;
    lVar6 = 0;
    lVar7 = 0;
    lVar8 = 0;
    for (; uVar5 != uVar3; uVar5 = uVar5 + 1) {
      for (lVar9 = 0; lVar9 < width; lVar9 = lVar9 + 4) {
        auVar22 = pmovzxbd(in_XMM2,*(undefined4 *)(dat8 + lVar9));
        auVar25 = pmovzxbd(in_XMM3,*(undefined4 *)(src8 + lVar9));
        piVar1 = flt1 + lVar9;
        auVar17._0_4_ = *piVar1 + auVar22._0_4_ * -0x10;
        auVar17._4_4_ = piVar1[1] + auVar22._4_4_ * -0x10;
        auVar17._8_4_ = piVar1[2] + auVar22._8_4_ * -0x10;
        auVar17._12_4_ = piVar1[3] + auVar22._12_4_ * -0x10;
        auVar30._0_4_ = (auVar25._0_4_ - auVar22._0_4_) * 0x10;
        auVar30._4_4_ = (auVar25._4_4_ - auVar22._4_4_) * 0x10;
        auVar30._8_4_ = (auVar25._8_4_ - auVar22._8_4_) * 0x10;
        auVar30._12_4_ = (auVar25._12_4_ - auVar22._12_4_) * 0x10;
        in_XMM2 = pmuldq(auVar17,auVar17);
        auVar20._4_4_ = auVar17._4_4_;
        auVar20._0_4_ = auVar17._4_4_;
        auVar20._8_4_ = auVar17._12_4_;
        auVar20._12_4_ = auVar17._12_4_;
        auVar25 = pmuldq(auVar17,auVar30);
        auVar22._4_4_ = 0;
        auVar22._0_4_ = auVar30._4_4_;
        auVar22._8_8_ = auVar30._8_8_ >> 0x20;
        in_XMM3 = pmuldq(auVar22,auVar20);
        auVar22 = pmuldq(auVar20,auVar20);
        lVar7 = lVar7 + in_XMM2._0_8_ + auVar22._0_8_;
        lVar8 = lVar8 + in_XMM2._8_8_ + auVar22._8_8_;
        lVar10 = lVar10 + auVar25._0_8_ + in_XMM3._0_8_;
        lVar6 = lVar6 + auVar25._8_8_ + in_XMM3._8_8_;
      }
      flt1 = flt1 + flt1_stride;
      src8 = src8 + src_stride;
      dat8 = dat8 + dat_stride;
    }
    *C = 0;
    C[1] = lVar6 + lVar10;
    H[1][0] = 0;
    H[1][1] = lVar8 + lVar7;
    lVar10 = (long)(height * width);
    H[1][1] = (lVar8 + lVar7) / lVar10;
  }
  else {
    if (params->r[1] < 1) {
      uVar5 = 0;
      uVar3 = 0;
      if (0 < height) {
        uVar3 = (ulong)(uint)height;
      }
      lVar10 = 0;
      lVar6 = 0;
      lVar7 = 0;
      lVar8 = 0;
      for (; uVar5 != uVar3; uVar5 = uVar5 + 1) {
        for (lVar9 = 0; lVar9 < width; lVar9 = lVar9 + 4) {
          auVar22 = pmovzxbd(in_XMM2,*(undefined4 *)(dat8 + lVar9));
          auVar25 = pmovzxbd(in_XMM3,*(undefined4 *)(src8 + lVar9));
          piVar1 = flt0 + lVar9;
          auVar18._0_4_ = *piVar1 + auVar22._0_4_ * -0x10;
          auVar18._4_4_ = piVar1[1] + auVar22._4_4_ * -0x10;
          auVar18._8_4_ = piVar1[2] + auVar22._8_4_ * -0x10;
          auVar18._12_4_ = piVar1[3] + auVar22._12_4_ * -0x10;
          auVar13._0_4_ = (auVar25._0_4_ - auVar22._0_4_) * 0x10;
          auVar13._4_4_ = (auVar25._4_4_ - auVar22._4_4_) * 0x10;
          auVar13._8_4_ = (auVar25._8_4_ - auVar22._8_4_) * 0x10;
          auVar13._12_4_ = (auVar25._12_4_ - auVar22._12_4_) * 0x10;
          in_XMM2 = pmuldq(auVar18,auVar18);
          auVar21._4_4_ = auVar18._4_4_;
          auVar21._0_4_ = auVar18._4_4_;
          auVar21._8_4_ = auVar18._12_4_;
          auVar21._12_4_ = auVar18._12_4_;
          auVar22 = pmuldq(auVar18,auVar13);
          auVar14._4_4_ = 0;
          auVar14._0_4_ = auVar13._4_4_;
          auVar14._8_8_ = auVar13._8_8_ >> 0x20;
          in_XMM3 = pmuldq(auVar14,auVar21);
          auVar25 = pmuldq(auVar21,auVar21);
          lVar7 = lVar7 + in_XMM2._0_8_ + auVar25._0_8_;
          lVar8 = lVar8 + in_XMM2._8_8_ + auVar25._8_8_;
          lVar10 = lVar10 + auVar22._0_8_ + in_XMM3._0_8_;
          lVar6 = lVar6 + auVar22._8_8_ + in_XMM3._8_8_;
        }
        flt0 = flt0 + flt0_stride;
        src8 = src8 + src_stride;
        dat8 = dat8 + dat_stride;
      }
      *C = lVar6 + lVar10;
      C[1] = 0;
      (*H)[0] = lVar8 + lVar7;
      (*H)[1] = 0;
      lVar10 = (long)(height * width);
      (*H)[0] = (lVar8 + lVar7) / lVar10;
      goto LAB_0039f7d9;
    }
    uVar5 = 0;
    uVar3 = 0;
    if (0 < height) {
      uVar3 = (ulong)(uint)height;
    }
    lVar12 = 0;
    lVar15 = 0;
    lVar10 = 0;
    lVar11 = 0;
    lVar6 = 0;
    lVar7 = 0;
    lVar16 = 0;
    lVar19 = 0;
    lVar8 = 0;
    lVar9 = 0;
    for (; uVar5 != uVar3; uVar5 = uVar5 + 1) {
      for (lVar4 = 0; lVar4 < width; lVar4 = lVar4 + 4) {
        auVar25 = pmovzxbd(in_XMM8,*(undefined4 *)(dat8 + lVar4));
        auVar22 = pmovzxbd(in_XMM6,*(undefined4 *)(src8 + lVar4));
        piVar1 = flt0 + lVar4;
        piVar2 = flt1 + lVar4;
        iVar24 = auVar25._0_4_;
        iVar26 = auVar25._4_4_;
        iVar27 = auVar25._8_4_;
        iVar28 = auVar25._12_4_;
        in_XMM6._0_4_ = (auVar22._0_4_ - iVar24) * 0x10;
        in_XMM6._4_4_ = (auVar22._4_4_ - iVar26) * 0x10;
        in_XMM6._8_4_ = (auVar22._8_4_ - iVar27) * 0x10;
        in_XMM6._12_4_ = (auVar22._12_4_ - iVar28) * 0x10;
        auVar23._0_4_ = *piVar1 + iVar24 * -0x10;
        auVar23._4_4_ = piVar1[1] + iVar26 * -0x10;
        auVar23._8_4_ = piVar1[2] + iVar27 * -0x10;
        auVar23._12_4_ = piVar1[3] + iVar28 * -0x10;
        auVar25._0_4_ = *piVar2 + iVar24 * -0x10;
        auVar25._4_4_ = piVar2[1] + iVar26 * -0x10;
        auVar25._8_4_ = piVar2[2] + iVar27 * -0x10;
        auVar25._12_4_ = piVar2[3] + iVar28 * -0x10;
        auVar22 = pmuldq(auVar23,auVar23);
        auVar29._4_4_ = auVar23._4_4_;
        auVar29._0_4_ = auVar23._4_4_;
        auVar29._8_4_ = auVar23._12_4_;
        auVar29._12_4_ = auVar23._12_4_;
        auVar30 = pmuldq(auVar29,auVar29);
        lVar8 = lVar8 + auVar22._0_8_ + auVar30._0_8_;
        lVar9 = lVar9 + auVar22._8_8_ + auVar30._8_8_;
        auVar22 = pmuldq(auVar25,auVar23);
        auVar31._4_4_ = auVar25._4_4_;
        auVar31._0_4_ = auVar25._4_4_;
        auVar31._8_4_ = auVar25._12_4_;
        auVar31._12_4_ = auVar25._12_4_;
        auVar30 = pmuldq(auVar31,auVar29);
        lVar16 = lVar16 + auVar22._0_8_ + auVar30._0_8_;
        lVar19 = lVar19 + auVar22._8_8_ + auVar30._8_8_;
        auVar22 = pmuldq(auVar25,auVar25);
        auVar30 = pmuldq(auVar31,auVar31);
        lVar6 = lVar6 + auVar22._0_8_ + auVar30._0_8_;
        lVar7 = lVar7 + auVar22._8_8_ + auVar30._8_8_;
        auVar22 = pmuldq(auVar23,in_XMM6);
        in_XMM8._4_4_ = in_XMM6._4_4_;
        in_XMM8._0_4_ = in_XMM6._4_4_;
        in_XMM8._8_4_ = in_XMM6._12_4_;
        in_XMM8._12_4_ = in_XMM6._12_4_;
        auVar30 = pmuldq(auVar29,in_XMM8);
        lVar10 = lVar10 + auVar22._0_8_ + auVar30._0_8_;
        lVar11 = lVar11 + auVar22._8_8_ + auVar30._8_8_;
        auVar22 = pmuldq(auVar25,in_XMM6);
        auVar25 = pmuldq(auVar31,in_XMM8);
        lVar12 = lVar12 + auVar22._0_8_ + auVar25._0_8_;
        lVar15 = lVar15 + auVar22._8_8_ + auVar25._8_8_;
      }
      flt1 = flt1 + flt1_stride;
      flt0 = flt0 + flt0_stride;
      src8 = src8 + src_stride;
      dat8 = dat8 + dat_stride;
    }
    *C = lVar11 + lVar10;
    C[1] = lVar15 + lVar12;
    lVar10 = (long)(height * width);
    (*H)[0] = (lVar9 + lVar8) / lVar10;
    lVar8 = (lVar19 + lVar16) / lVar10;
    (*H)[1] = lVar8;
    H[1][1] = (lVar7 + lVar6) / lVar10;
    H[1][0] = lVar8;
    *C = *C / lVar10;
  }
  C = C + 1;
LAB_0039f7d9:
  *C = *C / lVar10;
  return;
}

Assistant:

void av1_calc_proj_params_sse4_1(const uint8_t *src8, int width, int height,
                                 int src_stride, const uint8_t *dat8,
                                 int dat_stride, int32_t *flt0, int flt0_stride,
                                 int32_t *flt1, int flt1_stride,
                                 int64_t H[2][2], int64_t C[2],
                                 const sgr_params_type *params) {
  if ((params->r[0] > 0) && (params->r[1] > 0)) {
    calc_proj_params_r0_r1_sse4_1(src8, width, height, src_stride, dat8,
                                  dat_stride, flt0, flt0_stride, flt1,
                                  flt1_stride, H, C);
  } else if (params->r[0] > 0) {
    calc_proj_params_r0_sse4_1(src8, width, height, src_stride, dat8,
                               dat_stride, flt0, flt0_stride, H, C);
  } else if (params->r[1] > 0) {
    calc_proj_params_r1_sse4_1(src8, width, height, src_stride, dat8,
                               dat_stride, flt1, flt1_stride, H, C);
  }
}